

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

gnode_t * gnode_list_expr_create
                    (gtoken_s token,gnode_r *list1,gnode_r *list2,_Bool ismap,gnode_t *decl)

{
  gnode_t *pgVar1;
  gnode_list_expr_t *node;
  gnode_t *decl_local;
  _Bool ismap_local;
  gnode_r *list2_local;
  gnode_r *list1_local;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  pgVar1->tag = NODE_LIST_EXPR;
  memcpy(&pgVar1->token,&token,0x28);
  pgVar1->decl = decl;
  *(_Bool *)&pgVar1[1].tag = ismap;
  *(gnode_r **)&pgVar1[1].block_length = list1;
  *(gnode_r **)&pgVar1[1].token = list2;
  return pgVar1;
}

Assistant:

gnode_t *gnode_list_expr_create (gtoken_s token, gnode_r *list1, gnode_r *list2, bool ismap, gnode_t *decl) {
    gnode_list_expr_t *node = (gnode_list_expr_t *)mem_alloc(NULL, sizeof(gnode_list_expr_t));

    SETBASE(node, NODE_LIST_EXPR, token);
    SETDECL(node, decl);
    node->ismap = ismap;
    node->list1 = list1;
    node->list2 = list2;
    return (gnode_t *)node;
}